

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve2right4update
          (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *b,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *rhs)

{
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar1;
  int *ridx;
  int *piVar2;
  Tolerances *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer pnVar3;
  int *piVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  undefined1 auVar6 [56];
  int iVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  uint *puVar13;
  byte bVar14;
  undefined4 uStack_32c;
  undefined8 uStack_308;
  undefined4 uStack_2fc;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  undefined4 uStack_2c0;
  int f;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  uint local_230 [28];
  int local_1c0;
  undefined1 local_1bc;
  fpclass_type local_1b8;
  int32_t local_1b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t local_b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar14 = 0;
  uStack_2fc = (undefined4)((ulong)b >> 0x20);
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  iVar7 = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  piVar2 = (rhs->super_IdxSet).idx;
  this_01 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_02 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_01);
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 0x1c;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems[6] = 0;
  epsilon.m_backend.data._M_elems[7] = 0;
  epsilon.m_backend.data._M_elems[8] = 0;
  epsilon.m_backend.data._M_elems[9] = 0;
  epsilon.m_backend.data._M_elems[10] = 0;
  epsilon.m_backend.data._M_elems[0xb] = 0;
  epsilon.m_backend.data._M_elems[0xc] = 0;
  epsilon.m_backend.data._M_elems[0xd] = 0;
  epsilon.m_backend.data._M_elems[0xe] = 0;
  epsilon.m_backend.data._M_elems[0xf] = 0;
  epsilon.m_backend.data._M_elems[0x10] = 0;
  epsilon.m_backend.data._M_elems[0x11] = 0;
  epsilon.m_backend.data._M_elems[0x12] = 0;
  epsilon.m_backend.data._M_elems[0x13] = 0;
  epsilon.m_backend.data._M_elems[0x14] = 0;
  epsilon.m_backend.data._M_elems[0x15] = 0;
  epsilon.m_backend.data._M_elems[0x16] = 0;
  epsilon.m_backend.data._M_elems[0x17] = 0;
  epsilon.m_backend.data._M_elems[0x18] = 0;
  epsilon.m_backend.data._M_elems[0x19] = 0;
  epsilon.m_backend.data._M_elems._104_5_ = 0;
  epsilon.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&epsilon,a);
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  pnVar3 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar8 = (y->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pnVar8 != pnVar3; pnVar8 = pnVar8 + 1) {
    (pnVar8->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar8->m_backend).prec_elem = 0x1c;
    (pnVar8->m_backend).data._M_elems[0] = 0;
    (pnVar8->m_backend).data._M_elems[1] = 0;
    (pnVar8->m_backend).data._M_elems[2] = 0;
    (pnVar8->m_backend).data._M_elems[3] = 0;
    (pnVar8->m_backend).data._M_elems[4] = 0;
    (pnVar8->m_backend).data._M_elems[5] = 0;
    (pnVar8->m_backend).data._M_elems[6] = 0;
    (pnVar8->m_backend).data._M_elems[7] = 0;
    (pnVar8->m_backend).data._M_elems[8] = 0;
    (pnVar8->m_backend).data._M_elems[9] = 0;
    (pnVar8->m_backend).data._M_elems[10] = 0;
    (pnVar8->m_backend).data._M_elems[0xb] = 0;
    (pnVar8->m_backend).data._M_elems[0xc] = 0;
    (pnVar8->m_backend).data._M_elems[0xd] = 0;
    (pnVar8->m_backend).data._M_elems[0xe] = 0;
    (pnVar8->m_backend).data._M_elems[0xf] = 0;
    (pnVar8->m_backend).data._M_elems[0x10] = 0;
    (pnVar8->m_backend).data._M_elems[0x11] = 0;
    (pnVar8->m_backend).data._M_elems[0x12] = 0;
    (pnVar8->m_backend).data._M_elems[0x13] = 0;
    (pnVar8->m_backend).data._M_elems[0x14] = 0;
    (pnVar8->m_backend).data._M_elems[0x15] = 0;
    (pnVar8->m_backend).data._M_elems[0x16] = 0;
    (pnVar8->m_backend).data._M_elems[0x17] = 0;
    (pnVar8->m_backend).data._M_elems[0x18] = 0;
    (pnVar8->m_backend).data._M_elems[0x19] = 0;
    (pnVar8->m_backend).data._M_elems[0x1a] = 0;
    (pnVar8->m_backend).data._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(pnVar8->m_backend).data._M_elems + 0x6d) = 0;
  }
  this_00 = &this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  this->usetup = true;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&this->ssvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->ssvec,b);
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType == 0) {
    iVar1 = (this->ssvec).super_IdxSet.num;
    pnVar10 = &epsilon;
    pnVar12 = &local_b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar14 * -2 + 1) * 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = epsilon.m_backend.exp;
    local_b0.m_backend.neg = epsilon.m_backend.neg;
    local_b0.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_b0.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    x->setupStatus = false;
    piVar4 = (x->super_IdxSet).idx;
    pnVar10 = (x->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar12 = (this->ssvec).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar11 = &epsilon;
    puVar13 = local_130;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar13 = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
      puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
    }
    local_c0 = epsilon.m_backend.exp;
    local_bc = epsilon.m_backend.neg;
    local_b8 = epsilon.m_backend.fpclass;
    local_b4 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    auVar6 = ZEXT3256(CONCAT428(uStack_32c,
                                CONCAT424(iVar7,CONCAT816(piVar2,CONCAT88((rhs->
                                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  local_130)))));
    eps2_00.m_backend.data._M_elems[0xe] = 0x530ddd;
    eps2_00.m_backend.data._M_elems[0xf] = 0;
    eps2_00.m_backend.data._M_elems[0] = auVar6._0_4_;
    eps2_00.m_backend.data._M_elems[1] = auVar6._4_4_;
    eps2_00.m_backend.data._M_elems[2] = auVar6._8_4_;
    eps2_00.m_backend.data._M_elems[3] = auVar6._12_4_;
    eps2_00.m_backend.data._M_elems[4] = auVar6._16_4_;
    eps2_00.m_backend.data._M_elems[5] = auVar6._20_4_;
    eps2_00.m_backend.data._M_elems[6] = auVar6._24_4_;
    eps2_00.m_backend.data._M_elems[7] = auVar6._28_4_;
    eps2_00.m_backend.data._M_elems[8] = auVar6._32_4_;
    eps2_00.m_backend.data._M_elems[9] = auVar6._36_4_;
    eps2_00.m_backend.data._M_elems[10] = auVar6._40_4_;
    eps2_00.m_backend.data._M_elems[0xb] = auVar6._44_4_;
    eps2_00.m_backend.data._M_elems[0xc] = auVar6._48_4_;
    eps2_00.m_backend.data._M_elems[0xd] = auVar6._52_4_;
    eps2_00.m_backend.data._M_elems._64_8_ = uStack_308;
    eps2_00.m_backend.data._M_elems[0x12] = iVar1;
    eps2_00.m_backend.data._M_elems[0x13] = uStack_2fc;
    eps2_00.m_backend.data._M_elems._80_8_ = y;
    eps2_00.m_backend.data._M_elems._88_8_ = pnVar12;
    eps2_00.m_backend.data._M_elems._96_8_ = piVar4;
    eps2_00.m_backend.data._M_elems._104_8_ = this_00;
    eps2_00.m_backend._112_8_ = ridx;
    eps2_00.m_backend.fpclass = iVar7;
    eps2_00.m_backend.prec_elem = 0;
    iVar7 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::vSolveRight4update2
                      (this_00,&local_b0,pnVar10,piVar4,pnVar12,ridx,iVar1,pnVar5,eps2_00,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)rhs,(int *)CONCAT44(f,uStack_2c0),epsilon.m_backend.data._M_elems[0],
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)epsilon.m_backend.data._M_elems._8_8_,
                       (int *)epsilon.m_backend.data._M_elems._16_8_,
                       (int *)epsilon.m_backend.data._M_elems._24_8_);
    x->setupStatus = false;
    (x->super_IdxSet).num = iVar7;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->eta,x);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    iVar1 = (this->ssvec).super_IdxSet.num;
    pnVar10 = &epsilon;
    pnVar12 = &local_1b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar14 * -2 + 1) * 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = epsilon.m_backend.exp;
    local_1b0.m_backend.neg = epsilon.m_backend.neg;
    local_1b0.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_1b0.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    x->setupStatus = false;
    piVar4 = (x->super_IdxSet).idx;
    pnVar10 = (x->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar12 = (this->ssvec).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar11 = &epsilon;
    puVar13 = local_230;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar13 = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
      puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
    }
    local_1c0 = epsilon.m_backend.exp;
    local_1bc = epsilon.m_backend.neg;
    local_1b8 = epsilon.m_backend.fpclass;
    local_1b4 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar8 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    eps2.m_backend.data._M_elems._8_8_ = pnVar8;
    eps2.m_backend.data._M_elems._0_8_ = local_230;
    eps2.m_backend.data._M_elems._16_8_ = piVar2;
    eps2.m_backend.data._M_elems[6] = iVar7;
    eps2.m_backend.data._M_elems[7] = 0;
    eps2.m_backend.data._M_elems._32_8_ =
         (this->forest).
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    eps2.m_backend.data._M_elems._40_8_ = &f;
    eps2.m_backend.data._M_elems._48_8_ = (this->forest).super_IdxSet.idx;
    eps2.m_backend.data._M_elems[0xe] = 0x530df6;
    eps2.m_backend.data._M_elems[0xf] = 0;
    eps2.m_backend.data._M_elems._64_8_ = uStack_308;
    eps2.m_backend.data._M_elems[0x12] = iVar1;
    eps2.m_backend.data._M_elems[0x13] = 0;
    eps2.m_backend.data._M_elems._80_8_ = pnVar5;
    eps2.m_backend.data._M_elems._88_8_ = piVar4;
    eps2.m_backend.data._M_elems._96_8_ = piVar2;
    eps2.m_backend.data._M_elems._104_8_ = this_00;
    eps2.m_backend._112_8_ = ridx;
    eps2.m_backend.fpclass = iVar7;
    eps2.m_backend.prec_elem = 0;
    iVar7 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::vSolveRight4update2
                      (this_00,&local_1b0,pnVar10,piVar4,pnVar12,ridx,iVar1,pnVar5,eps2,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)rhs,(int *)CONCAT44(f,uStack_2c0),epsilon.m_backend.data._M_elems[0],
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)epsilon.m_backend.data._M_elems._8_8_,
                       (int *)epsilon.m_backend.data._M_elems._16_8_,
                       (int *)epsilon.m_backend.data._M_elems._24_8_);
    (x->super_IdxSet).num = iVar7;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve2right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update2(epsilon, x.altValues(), x.altIndexMem(),
                                    ssvec.get_ptr(), sidx, n, y.get_ptr(),
                                    epsilon, rhs.altValues(), ridx, rsize, nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update2(epsilon, x.altValues(), x.altIndexMem(),
                                    ssvec.get_ptr(), sidx, n, y.get_ptr(),
                                    epsilon, rhs.altValues(), ridx, rsize,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}